

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

bool __thiscall
ON_3dmObjectAttributes::Internal_WriteV5(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  object_material_source oVar5;
  uint uVar6;
  ON_3dmObjectAttributesPrivate *pOVar8;
  ON_Color *pOVar9;
  ulong uVar10;
  ON_Color *pOVar11;
  element_type *peVar12;
  ON_SectionStyle *this_00;
  double dVar13;
  ON_Xform xform;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_b0 [32];
  int iVar7;
  
  if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
    uVar4 = ON_BinaryArchive::Archive3dmVersion(file);
    ON_DecalCollection::UpdateUserData(&this->m_private->m_decals,uVar4);
  }
  cVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,2,0xd);
  if ((((bool)cVar1) && (cVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_uuid), (bool)cVar1)) &&
     (cVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Layer,this->m_layer_index),
     (bool)cVar1)) {
    bVar2 = ON_wString::IsEmpty(&this->m_name);
    if ((bVar2) ||
       ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x01'), (bool)cVar1 &&
        (cVar1 = ON_BinaryArchive::WriteString(file,&this->m_name), (bool)cVar1)))) {
      bVar2 = ON_wString::IsEmpty(&this->m_url);
      if ((((bVar2) ||
           ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x02'), (bool)cVar1 &&
            (cVar1 = ON_BinaryArchive::WriteString(file,&this->m_url), (bool)cVar1)))) &&
          (((this->m_linetype_index == -1 ||
            ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x03'), (bool)cVar1 &&
             (cVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                (file,LinePattern,this->m_linetype_index), (bool)cVar1)))) &&
           ((this->m_material_index == -1 ||
            ((oVar5 = ON::ObjectMaterialSource((uint)this->m_material_source),
             oVar5 != material_from_object ||
             ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x04'), (bool)cVar1 &&
              (cVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                 (file,Material,this->m_material_index), (bool)cVar1)))))))))) &&
         ((((this->m_rendering_attributes).m_mappings.m_count < 1 &&
           (((((this->m_rendering_attributes).super_ON_RenderingAttributes.m_materials.m_count < 1
              && ((this->m_rendering_attributes).m_bCastsShadows != false)) &&
             ((this->m_rendering_attributes).m_bReceivesShadows != false)) &&
            (bVar2 = ON_ObjectRenderingAttributes::AdvancedTexturePreview
                               (&this->m_rendering_attributes), !bVar2)))) ||
          ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x05'), (bool)cVar1 &&
           (cVar1 = ON_ObjectRenderingAttributes::Write(&this->m_rendering_attributes,file),
           (bool)cVar1)))))) {
        uVar4 = ON_Color::operator_cast_to_unsigned_int(&this->m_color);
        if ((uVar4 == 0) ||
           ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x06'), (bool)cVar1 &&
            (cVar1 = ON_BinaryArchive::WriteColor(file,&this->m_color), (bool)cVar1)))) {
          uVar4 = ON_Color::operator_cast_to_unsigned_int(&this->m_plot_color);
          if ((((uVar4 == 0) ||
               ((cVar1 = ON_BinaryArchive::WriteChar(file,'\a'), (bool)cVar1 &&
                (cVar1 = ON_BinaryArchive::WriteColor(file,&this->m_plot_color), (bool)cVar1)))) &&
              ((((((((this->m_plot_weight_mm == 0.0 && (!NAN(this->m_plot_weight_mm))) ||
                    ((cVar1 = ON_BinaryArchive::WriteChar(file,'\b'), (bool)cVar1 &&
                     (cVar1 = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm),
                     (bool)cVar1)))) &&
                   ((this->m_object_decoration == no_object_decoration ||
                    ((cVar1 = ON_BinaryArchive::WriteChar(file,'\t'), (bool)cVar1 &&
                     (cVar1 = ON_BinaryArchive::WriteChar(file,(char)this->m_object_decoration),
                     (bool)cVar1)))))) &&
                  ((this->m_wire_density == 1 ||
                   ((cVar1 = ON_BinaryArchive::WriteChar(file,'\n'), (bool)cVar1 &&
                    (cVar1 = ON_BinaryArchive::WriteInt(file,this->m_wire_density), (bool)cVar1)))))
                  ) && ((this->m_bVisible != false ||
                        ((cVar1 = ON_BinaryArchive::WriteChar(file,'\v'), (bool)cVar1 &&
                         (cVar1 = ON_BinaryArchive::WriteBool(file,this->m_bVisible), (bool)cVar1)))
                        ))) &&
                (((this->m_mode == '\0' ||
                  ((cVar1 = ON_BinaryArchive::WriteChar(file,'\f'), (bool)cVar1 &&
                   (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_mode), (bool)cVar1)))) &&
                 ((this->m_color_source == '\0' ||
                  ((cVar1 = ON_BinaryArchive::WriteChar(file,'\r'), (bool)cVar1 &&
                   (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_color_source), (bool)cVar1)))))
                 ))) && ((this->m_plot_color_source == '\0' ||
                         ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x0e'), (bool)cVar1 &&
                          (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_plot_color_source),
                          (bool)cVar1)))))))) &&
             (((this->m_plot_weight_source == '\0' ||
               ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x0f'), (bool)cVar1 &&
                (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_plot_weight_source), (bool)cVar1))
               )) && (((this->m_material_source == '\0' ||
                       ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x10'), (bool)cVar1 &&
                        (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_material_source),
                        (bool)cVar1)))) &&
                      ((this->m_linetype_source == '\0' ||
                       ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x11'), (bool)cVar1 &&
                        (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_linetype_source),
                        (bool)cVar1)))))))))) {
            if (0 < (this->m_group).m_count) {
              bVar2 = ON_BinaryArchive::WriteChar(file,'\x12');
              if (!bVar2) {
                return bVar2;
              }
              iVar7 = (this->m_group).m_count;
              cVar1 = ON_BinaryArchive::WriteInt(file,iVar7);
              if ((bool)cVar1 && 0 < (long)iVar7) {
                uVar10 = 1;
                do {
                  cVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                    (file,Group,(this->m_group).m_a[uVar10 - 1]);
                  if ((ulong)(long)iVar7 <= uVar10) break;
                  uVar10 = uVar10 + 1;
                } while ((bool)cVar1);
              }
              if ((bool)cVar1 == false) {
                return false;
              }
            }
            if ((this->m_space == model_space) ||
               ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x13'), (bool)cVar1 &&
                (cVar1 = ON_BinaryArchive::WriteChar(file,this->m_space), (bool)cVar1)))) {
              bVar2 = ON_UuidIsNil(&this->m_viewport_id);
              if (((bVar2) ||
                  ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x14'), (bool)cVar1 &&
                   (cVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_viewport_id), (bool)cVar1))))
                 && ((((this->m_dmref).m_count < 1 ||
                      ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x15'), (bool)cVar1 &&
                       (cVar1 = ON_BinaryArchive::WriteArray(file,&this->m_dmref), (bool)cVar1))))
                     && ((this->m_display_order == 0 ||
                         ((cVar1 = ON_BinaryArchive::WriteChar(file,'\x16'), (bool)cVar1 &&
                          (cVar1 = ON_BinaryArchive::WriteInt(file,this->m_display_order),
                          (bool)cVar1)))))))) {
                pOVar8 = this->m_private;
                if (pOVar8 == (ON_3dmObjectAttributesPrivate *)0x0) {
                  this_00 = (ON_SectionStyle *)0x0;
                }
                else {
                  this_00 = (pOVar8->m_custom_section_style).
                            super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  if (pOVar8->m_section_attributes_source != FromLayer) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'\x1d');
                    if (!bVar2) {
                      return bVar2;
                    }
                    pOVar8 = &DefaultAttributesPrivate;
                    if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
                      pOVar8 = this->m_private;
                    }
                    cVar1 = ON_BinaryArchive::WriteChar(file,pOVar8->m_section_attributes_source);
                    if (!(bool)cVar1) {
                      return (bool)cVar1;
                    }
                  }
                  dVar13 = 1.0;
                  if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
                    dVar13 = this->m_private->m_linetype_scale;
                  }
                  if (2.220446049250313e-16 < ABS(1.0 - dVar13)) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'!');
                    if (!bVar2) {
                      return bVar2;
                    }
                    if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
                      dVar13 = 1.0;
                    }
                    else {
                      dVar13 = this->m_private->m_linetype_scale;
                    }
                    cVar1 = ON_BinaryArchive::WriteDouble(file,dVar13);
                    if (!(bool)cVar1) {
                      return (bool)cVar1;
                    }
                  }
                  pOVar9 = &this->m_private->m_hatch_background_fill;
                  pOVar11 = &ON_Color::UnsetColor;
                  if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
                    pOVar9 = &ON_Color::UnsetColor;
                  }
                  local_b0[0] = pOVar9->field_0;
                  uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)local_b0);
                  uVar6 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
                  if (uVar4 != uVar6) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'\"');
                    if (!bVar2) {
                      return bVar2;
                    }
                    if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
                      pOVar11 = &this->m_private->m_hatch_background_fill;
                    }
                    local_b0[0] = pOVar11->field_0;
                    cVar1 = ON_BinaryArchive::WriteColor(file,(ON_Color *)local_b0);
                    if (!(bool)cVar1) {
                      return (bool)cVar1;
                    }
                  }
                  pOVar8 = this->m_private;
                  if (pOVar8 == (ON_3dmObjectAttributesPrivate *)0x0) {
                    pOVar8 = &DefaultAttributesPrivate;
                  }
                  if (pOVar8->m_hatch_boundary_visible == true) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'#');
                    if (!bVar2) {
                      return bVar2;
                    }
                    pOVar8 = &DefaultAttributesPrivate;
                    if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
                      pOVar8 = this->m_private;
                    }
                    cVar1 = ON_BinaryArchive::WriteBool(file,pOVar8->m_hatch_boundary_visible);
                    if (!(bool)cVar1) {
                      return (bool)cVar1;
                    }
                  }
                }
                bVar2 = ON_Plane::operator!=(&this->m_object_frame,&ON_Plane::UnsetPlane);
                if (bVar2) {
                  bVar2 = ON_BinaryArchive::WriteChar(file,'$');
                  if (!bVar2) {
                    return bVar2;
                  }
                  ON_Xform::ON_Xform((ON_Xform *)local_b0);
                  ON_Xform::ChangeBasis
                            ((ON_Xform *)local_b0,&this->m_object_frame,&ON_Plane::World_xy);
                  cVar1 = ON_BinaryArchive::WriteXform(file,(ON_Xform *)local_b0);
                  if (!(bool)cVar1) {
                    return (bool)cVar1;
                  }
                }
                if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
                  peVar12 = (element_type *)0x0;
                }
                else {
                  peVar12 = (this->m_private->m_custom_linetype).
                            super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                }
                if (peVar12 == (element_type *)0x0) {
                  cVar3 = '\x01';
                }
                else {
                  cVar1 = ON_BinaryArchive::WriteChar(file,'&');
                  if ((bool)cVar1) {
                    iVar7 = (*(peVar12->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10]
                            )(peVar12);
                    cVar3 = (char)iVar7;
                    cVar1 = cVar3;
                  }
                  else {
                    cVar3 = '\0';
                  }
                }
                if (cVar3 != '\0') {
                  if ((this_00 != (ON_SectionStyle *)0x0) &&
                     (bVar2 = ON_SectionStyle::SectionAttributesEqual
                                        (this_00,&ON_SectionStyle::Unset), !bVar2)) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'\'');
                    if (!bVar2) {
                      return bVar2;
                    }
                    iVar7 = (*(this_00->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10]
                            )(this_00);
                    if ((char)iVar7 == '\0') {
                      return (bool)'\0';
                    }
                  }
                  pOVar8 = this->m_private;
                  if (pOVar8 == (ON_3dmObjectAttributesPrivate *)0x0) {
                    pOVar8 = &DefaultAttributesPrivate;
                  }
                  if (pOVar8->m_section_label_style != None) {
                    bVar2 = ON_BinaryArchive::WriteChar(file,'(');
                    if (!bVar2) {
                      return bVar2;
                    }
                    pOVar8 = &DefaultAttributesPrivate;
                    if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
                      pOVar8 = this->m_private;
                    }
                    bVar2 = ON_BinaryArchive::WriteChar(file,pOVar8->m_section_label_style);
                    if (!bVar2) {
                      return bVar2;
                    }
                  }
                  cVar1 = ON_BinaryArchive::WriteChar(file,'\0');
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)cVar1;
}

Assistant:

bool ON_3dmObjectAttributes::Internal_WriteV5( ON_BinaryArchive& file ) const
{
  if (m_private)
  {
    // Have the decal collection update the user data if anything has changed and there
    // is actually decal data for which a user data object is needed. Note that this is
    // not actually needed when running Rhino because the RDK decal UI directly updates
    // the user data when changes are made. This is only needed when using ONX_Model and
    // File3dm outside of Rhino, in case the programmer sets a decal property.
    const unsigned int archive_3dm_version = file.Archive3dmVersion();
    m_private->m_decals.UpdateUserData(archive_3dm_version);
  }

  unsigned char c;
  // 29 Nov. 2009 S. Baer
  // Chunk version updated to 2.1 in order to support m_display_order
  // 12 Aug 2021 S. Baer
  // The next minor chunk version should be 3. There was a 24 hour period
  // where files could contain some extra information in a 2.2 chunk
  // 29 Sept 2021 S. Baer
  // Chunk version updated to 2.3 to support ClipParticipationSource and
  // clip participation list
  // 18 Oct 2021 S. Baer
  // Chunk version = 2.4 to support section hatch attributes
  // 5 Nov 2021 S. Baer
  // Chunk version = 2.5 to support linetype scale
  // 10 Jan 2022 S. Baer
  // Chunk version = 2.6 to support hatch background fill and hatch boundary visibility
  // 26 Jan 2022 Andy Le Bihan
  // Chunk version 2.7 was skipped
  // Chunk version = 2.8 to support object frame.
  // 15 Jun 2022 S. Baer
  // Chunk version = 2.9 to support SectionFillRule
  // 30 Nov 2022 S. Baer
  // Chunk version = 2.10 to support custom linetype
  // 18 Apr 2023 S. Baer
  // Chunk version = 2.11 to support custom section style
  // 10 May 2023 S. Baer
  // Chunk version = 2.12 to support ClippingPlaneLabelStyle
  // 11 May 2023 S. Baer
  // Chunk version = 2.13 to support SelectiveClippingListType
  bool rc = file.Write3dmChunkVersion(2,13);
  while(rc)
  {
    if (!rc) break;
    rc = file.WriteUuid(m_uuid);
    if (!rc) break;
    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::Layer, m_layer_index);
    if (!rc) break;

    // write non-default settings - skip everything else
    if ( !m_name.IsEmpty() )
    {
      c = 1;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteString(m_name);
      if (!rc) break;
    }
    if ( !m_url.IsEmpty() )
    {
      c = 2;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteString(m_url);
      if (!rc) break;
    }
    if ( -1 != m_linetype_index )
    {
      c = 3;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index);
      if (!rc) break;
    }
    if ( -1 != m_material_index && MaterialSource() == ON::material_from_object)
    {
      c = 4;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index);
      if (!rc) break;
    }
    if (    m_rendering_attributes.m_mappings.Count() > 0
         || m_rendering_attributes.m_materials.Count() > 0
         || true != m_rendering_attributes.m_bCastsShadows
         || true != m_rendering_attributes.m_bReceivesShadows
         || false != m_rendering_attributes.AdvancedTexturePreview()
         )
    {
      c = 5;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = m_rendering_attributes.Write(file);
      if (!rc) break;
    }
    if ( 0 != m_color )
    {
      c = 6;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteColor(m_color);
      if (!rc) break;
    }
    if ( 0 != m_plot_color )
    {
      c = 7;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteColor(m_plot_color);
      if (!rc) break;
    }
    if ( 0.0 != m_plot_weight_mm )
    {
      c = 8;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteDouble(m_plot_weight_mm);
      if (!rc) break;
    }
    if ( ON::no_object_decoration != m_object_decoration )
    {
      c = 9;
      rc = file.WriteChar(c);
      if (!rc) break;
      c = (unsigned char)m_object_decoration;
      rc = file.WriteChar(c);
      if (!rc) break;
    }
    if ( 1 != m_wire_density )
    {
      c = 10;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteInt(m_wire_density);
      if (!rc) break;
    }
    if ( true != m_bVisible )
    {
      c = 11;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(m_bVisible);
      if (!rc) break;
    }
    if ( ON::normal_object != m_mode )
    {
      c = 12;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_mode);
      if (!rc) break;
    }
    if ( ON::color_from_layer != m_color_source )
    {
      c = 13;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_color_source);
      if (!rc) break;
    }
    if ( ON::plot_color_from_layer != m_plot_color_source )
    {
      c = 14;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_plot_color_source);
      if (!rc) break;
    }
    if ( ON::plot_weight_from_layer != m_plot_weight_source )
    {
      c = 15;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_plot_weight_source);
      if (!rc) break;
    }
    if ( ON::material_from_layer != m_material_source )
    {
      c = 16;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_material_source);
      if (!rc) break;
    }
    if ( ON::linetype_from_layer != m_linetype_source )
    {
      c = 17;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_linetype_source);
      if (!rc) break;
    }
    if ( m_group.Count() > 0 )
    {
      c = 18;
      rc = file.WriteChar(c);
      if (!rc) break;
      int count = m_group.Count();
      rc = file.WriteInt(count);
      for ( int i = 0; i < count && rc; i++)
        rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Group, m_group[i]);
      if (!rc) break;
    }
    if ( ON::model_space != m_space )
    {
      c = 19;
      rc = file.WriteChar(c);
      if (!rc) break;
      c = (unsigned char)m_space;
      rc = file.WriteChar(c);
      if (!rc) break;
    }
    if ( !ON_UuidIsNil(m_viewport_id) )
    {
      c = 20;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteUuid(m_viewport_id);
      if (!rc) break;
    }
    if ( m_dmref.Count() > 0 )
    {
      c = 21;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteArray(m_dmref);
      if (!rc) break;
    }

    // 29 Nov. 2009 - S. Baer
    // Only write m_display_order if it's value!=0
    // m_display_order is written to version 2.1 files
    if ( 0 != m_display_order )
    {
      c = 22;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteInt(m_display_order);
      if (!rc) break;
    }

    const ON_SectionStyle* customSectionStyle = CustomSectionStyle();
    // 12 Aug 2021 S. Baer
    // Items 23, 24, 25, 26 were in a version of Rhino 8 WIP for about 24 hours.
    // They were most likely never used by anyone

    // New attribute non-default values are all held in the m_private variable.
    // If this variable is nullptr, then all of the following properties will
    // be default which means there is no need to check their state
    if (m_private)
    {
      //if (ClipParticipationSource() != ON::ClipParticipationSource::FromLayer)
      //{
      //  c = ON_3dmObjectAttributesTypeCodes::ClipParticipationSource; // 27
      //  rc = file.WriteChar(c);
      //  if (!rc) break;
      //  rc = file.WriteChar((unsigned char)ClipParticipationSource());
      //  if (!rc) break;
      //}

      //{
      //  bool forAllClippingPlanes = true;
      //  bool forNoClippingPlanes = false;
      //  ON_UuidList selectiveClipping;
      //  bool isParticipationList = true;
      //  GetClipParticipation(forAllClippingPlanes, forNoClippingPlanes, selectiveClipping, isParticipationList);
      //  if (!forAllClippingPlanes)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SelectiveClippingData; // 28
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteBool(forNoClippingPlanes);
      //    if (!rc) break;
      //    rc = selectiveClipping.Write(file);
      //    if (!rc) break;
      //  }
      //}

      if (SectionAttributesSource() != ON::SectionAttributesSource::FromLayer)
      {
        c = ON_3dmObjectAttributesTypeCodes::SectionAttributesSource; // 29
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteChar((unsigned char)SectionAttributesSource());
        if (!rc) break;
      }

      // 23 April 2023 S. Baer
      // Stop writing individual section attributes. All section attribute IO has been
      // moved to writing an ON_SectionStyle instance
      //if (customSectionStyle)
      //{
      //  if (customSectionStyle->HatchIndex() != ON_UNSET_INT_INDEX)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchIndex; // 30
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, customSectionStyle->HatchIndex());
      //    if (!rc) break;
      //  }

      //  if (customSectionStyle->HatchScale() != 1.0)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchScale; // 31
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteDouble(customSectionStyle->HatchScale());
      //    if (!rc) break;
      //  }

      //  if (customSectionStyle->HatchRotation() != 0.0)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchRotation; // 32
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteDouble(customSectionStyle->HatchRotation());
      //    if (!rc) break;
      //  }
      //}

      if (fabs(1.0 - LinetypePatternScale()) > ON_EPSILON)
      {
        c = ON_3dmObjectAttributesTypeCodes::LinetypeScale; // 33
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteDouble(LinetypePatternScale());
        if (!rc) break;
      }

      if (HatchBackgroundFillColor() != ON_Color::UnsetColor)
      {
        c = ON_3dmObjectAttributesTypeCodes::HatchBackgroundFill; // 34
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteColor(HatchBackgroundFillColor());
        if (!rc) break;
      }

      if (HatchBoundaryVisible() != false)
      {
        c = ON_3dmObjectAttributesTypeCodes::HatchBoundaryVisible; // 35
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteBool(HatchBoundaryVisible());
        if (!rc) break;
      }
    }

    // 15 Jun 2022 S. Baer
    // Do not write items if they are their default value.
    if (m_object_frame != ON_Plane::UnsetPlane)
    {
      // 26 Jan 2022 Andy Le Bihan
      // Always write the object frame - it will always be initialized.
      c = ON_3dmObjectAttributesTypeCodes::ObjectFrame;
      rc = file.WriteChar(c);
      if (!rc) break;

      ON_Xform xform;
      xform.ChangeBasis(m_object_frame, ON_Plane::World_xy);
      rc = file.WriteXform(xform);
      if (!rc) break;
    }

    // 23 April 2023 S. Baer
    // Stop writing individual section attributes. All section attribute IO has been
    // moved to writing an ON_SectionStyle instance
    //if (customSectionStyle)
    //{
    //  if (customSectionStyle->SectionFillRule() != ON::SectionFillRule::ClosedCurves)
    //  {
    //    c = ON_3dmObjectAttributesTypeCodes::SectionFillRule; // 37
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteChar((unsigned char)(customSectionStyle->SectionFillRule()));
    //    if (!rc) break;
    //  }
    //}

    // 30 Nov 2022 S. Baer
    // Write custom linetype
    {
      const ON_Linetype* linetype = CustomLinetype();
      if (linetype)
      {
        c = ON_3dmObjectAttributesTypeCodes::CustomLinetype; // 38
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = linetype->Write(file);
        if (!rc) break;
      }
    }

    // 18 Apr 2023 S. Baer
    // Write custom section style
    if (customSectionStyle && !customSectionStyle->SectionAttributesEqual(ON_SectionStyle::Unset))
    {
      c = ON_3dmObjectAttributesTypeCodes::CustomSectionStyle; // 39
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = customSectionStyle->Write(file);
      if (!rc) break;
    }

    if (ClippingPlaneLabelStyle() != ON::SectionLabelStyle::None)
    {
      c = ON_3dmObjectAttributesTypeCodes::ClippingPlaneLabelStyle; // 40
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar((unsigned char)(ClippingPlaneLabelStyle()));
      if (!rc) break;
    }

    //if (m_private && false == m_private->m_clipplane_list_is_participation)
    //{
    //  c = ON_3dmObjectAttributesTypeCodes::SelectiveClippingListType; //41
    //  rc = file.WriteChar(c);
    //  if (!rc) break;
    //  rc = file.WriteBool(m_private->m_clipplane_list_is_participation);
    //  if (!rc) break;
    //}

    // 0 indicates end of attributes - this should be the last item written
    c = 0;
    rc = file.WriteChar(c);
    break;
  }
  return rc;
}